

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O1

void sx_os_sleep(int ms)

{
  timespec rem;
  timespec req;
  timespec local_28;
  timespec local_10;
  
  local_10.tv_sec = (__time_t)(ms / 1000);
  local_10.tv_nsec = (long)((ms % 1000) * 1000000);
  local_28.tv_sec = 0;
  local_28.tv_nsec = 0;
  nanosleep(&local_10,&local_28);
  return;
}

Assistant:

void sx_os_sleep(int ms)
{
#if SX_PLATFORM_WINDOWS
    Sleep(ms);
#else
    struct timespec req = { (time_t)ms / 1000, (long)((ms % 1000) * 1000000) };
    struct timespec rem = { 0, 0 };
    nanosleep(&req, &rem);
#endif    // SX_PLATFORM_
}